

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tunnel_connector.cpp
# Opt level: O0

shared_ptr<bidfx_public_api::tools::Client> __thiscall
bidfx_public_api::tools::TunnelConnector::Connect(TunnelConnector *this,milliseconds read_timeout)

{
  byte bVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<bidfx_public_api::tools::Client> sVar4;
  failure *e;
  string local_100 [32];
  undefined1 local_e0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined8 local_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_30 [8];
  shared_ptr<bidfx_public_api::tools::Client> client;
  TunnelConnector *this_local;
  milliseconds read_timeout_local;
  
  client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)read_timeout.__r;
  read_timeout_local.__r = (rep)this;
  std::shared_ptr<bidfx_public_api::tools::Client>::shared_ptr
            ((shared_ptr<bidfx_public_api::tools::Client> *)local_30,(nullptr_t)0x0);
  bVar1 = (**(code **)(**(long **)read_timeout.__r + 0x40))();
  if ((bVar1 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)Log);
    (**(code **)**(undefined8 **)read_timeout.__r)(local_e0 + 0x18);
    local_e0._20_4_ = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    spdlog::logger::info<std::__cxx11::string,int>
              (peVar2,"Connecting to {}:{}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_e0 + 0x18),(int *)(local_e0 + 0x14));
    std::__cxx11::string::~string((string *)(local_e0 + 0x18));
    (**(code **)**(undefined8 **)read_timeout.__r)(local_100);
    (**(code **)(**(long **)read_timeout.__r + 0x38))();
    std::make_shared<bidfx_public_api::tools::DirectClient,std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
               (int *)local_100);
    std::shared_ptr<bidfx_public_api::tools::Client>::operator=
              ((shared_ptr<bidfx_public_api::tools::Client> *)local_30,
               (shared_ptr<bidfx_public_api::tools::DirectClient> *)local_e0);
    std::shared_ptr<bidfx_public_api::tools::DirectClient>::~shared_ptr
              ((shared_ptr<bidfx_public_api::tools::DirectClient> *)local_e0);
    std::__cxx11::string::~string(local_100);
    peVar3 = std::
             __shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    (*peVar3->_vptr_Client[2])();
  }
  else {
    peVar2 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)Log);
    (**(code **)**(undefined8 **)read_timeout.__r)(&local_60);
    local_80.field_2._12_4_ = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    local_80.field_2._M_allocated_capacity =
         std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                   ((duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
    spdlog::logger::info<std::__cxx11::string,int,long>
              (peVar2,"Connecting using SSL to {}:{} with read timeout {}ms",&local_60,
               (int *)(local_80.field_2._M_local_buf + 0xc),(long *)local_80.field_2._M_local_buf);
    std::__cxx11::string::~string((string *)&local_60);
    (**(code **)**(undefined8 **)read_timeout.__r)((long)&local_a4 + 4);
    local_a4._0_4_ = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    std::
    make_shared<bidfx_public_api::tools::OpenSSLClient,std::__cxx11::string,int,std::chrono::duration<long,std::ratio<1l,1000l>>&>
              (&local_80,(int *)((long)&local_a4 + 4),
               (duration<long,_std::ratio<1L,_1000L>_> *)&local_a4);
    std::shared_ptr<bidfx_public_api::tools::Client>::operator=
              ((shared_ptr<bidfx_public_api::tools::Client> *)local_30,
               (shared_ptr<bidfx_public_api::tools::OpenSSLClient> *)&local_80);
    std::shared_ptr<bidfx_public_api::tools::OpenSSLClient>::~shared_ptr
              ((shared_ptr<bidfx_public_api::tools::OpenSSLClient> *)&local_80);
    std::__cxx11::string::~string((string *)((long)&local_a4 + 4));
    peVar3 = std::
             __shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    (*peVar3->_vptr_Client[2])();
    peVar3 = std::
             __shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
    TunnelThroughToServer((TunnelConnector *)read_timeout.__r,peVar3);
  }
  std::shared_ptr<bidfx_public_api::tools::Client>::shared_ptr
            ((shared_ptr<bidfx_public_api::tools::Client> *)this,
             (shared_ptr<bidfx_public_api::tools::Client> *)local_30);
  std::shared_ptr<bidfx_public_api::tools::Client>::~shared_ptr
            ((shared_ptr<bidfx_public_api::tools::Client> *)local_30);
  sVar4.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<bidfx_public_api::tools::Client>)
         sVar4.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Client> TunnelConnector::Connect(std::chrono::milliseconds read_timeout)
{
    try
    {
        std::shared_ptr<Client> client = nullptr;

        if (user_info_.IsTunnelRequired())
        {
            Log->info("Connecting using SSL to {}:{} with read timeout {}ms", user_info_.GetHost(), user_info_.GetPort(), read_timeout.count());
            client = std::make_shared<OpenSSLClient>(user_info_.GetHost(), user_info_.GetPort(), read_timeout);
            client->Start();
            TunnelThroughToServer(*client);
        }
        else
        {
            Log->info("Connecting to {}:{}", user_info_.GetHost(), user_info_.GetPort());
            client = std::make_shared<DirectClient>(user_info_.GetHost(), user_info_.GetPort());
            client->Start();
        }

        return std::move(client);
    }
    catch (std::ios_base::failure &e)
    {
        Log->warn("exception during handshake: {}", e.what());
        throw std::ios_base::failure(e);
    }
}